

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParameterizedTestCaseInfo<PushPopTest> * __thiscall
testing::internal::ParameterizedTestCaseRegistry::GetTestCasePatternHolder<PushPopTest>
          (ParameterizedTestCaseRegistry *this,char *test_case_name,CodeLocation *code_location)

{
  bool bVar1;
  int iVar2;
  reference ppPVar3;
  undefined4 extraout_var;
  TypeId pvVar4;
  ParameterizedTestCaseInfo<PushPopTest> *__x;
  CodeLocation *in_RSI;
  CodeLocation *in_RDI;
  char *unaff_retaddr;
  iterator it;
  ParameterizedTestCaseInfo<PushPopTest> *typed_test_info;
  CodeLocation *in_stack_ffffffffffffff28;
  CodeLocation *in_stack_ffffffffffffff30;
  CodeLocation *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 uVar5;
  ParameterizedTestCaseInfo<PushPopTest> *in_stack_ffffffffffffff70;
  __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
  local_28;
  ParameterizedTestCaseInfo<PushPopTest> *local_20;
  CodeLocation *local_10;
  
  local_20 = (ParameterizedTestCaseInfo<PushPopTest> *)0x0;
  local_10 = in_RSI;
  local_28._M_current =
       (ParameterizedTestCaseInfoBase **)
       std::
       vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
       ::begin((vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                *)in_stack_ffffffffffffff28);
  do {
    std::
    vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
    ::end((vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
           *)in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar1) {
LAB_0015fcd2:
      if (local_20 == (ParameterizedTestCaseInfo<PushPopTest> *)0x0) {
        __x = (ParameterizedTestCaseInfo<PushPopTest> *)operator_new(0x80);
        uVar5 = 1;
        CodeLocation::CodeLocation(local_10,(CodeLocation *)__x);
        ParameterizedTestCaseInfo<PushPopTest>::ParameterizedTestCaseInfo
                  (in_stack_ffffffffffffff70,(char *)CONCAT17(uVar5,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60);
        local_20 = __x;
        CodeLocation::~CodeLocation((CodeLocation *)0x15fd42);
        std::
        vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
        ::push_back((vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                     *)local_10,(value_type *)__x);
      }
      return local_20;
    }
    ppPVar3 = __gnu_cxx::
              __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
              ::operator*(&local_28);
    (*(*ppPVar3)->_vptr_ParameterizedTestCaseInfoBase[2])();
    bVar1 = std::operator==(&in_stack_ffffffffffffff30->file,(char *)in_stack_ffffffffffffff28);
    if (bVar1) {
      ppPVar3 = __gnu_cxx::
                __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
                ::operator*(&local_28);
      iVar2 = (*(*ppPVar3)->_vptr_ParameterizedTestCaseInfoBase[3])();
      pvVar4 = GetTypeId<PushPopTest>();
      if ((TypeId)CONCAT44(extraout_var,iVar2) == pvVar4) {
        __gnu_cxx::
        __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
        ::operator*(&local_28);
        local_20 = CheckedDowncastToActualType<testing::internal::ParameterizedTestCaseInfo<PushPopTest>,testing::internal::ParameterizedTestCaseInfoBase>
                             ((ParameterizedTestCaseInfoBase *)in_stack_ffffffffffffff60);
      }
      else {
        CodeLocation::CodeLocation(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        ReportInvalidTestCaseType(unaff_retaddr,in_RDI);
        CodeLocation::~CodeLocation((CodeLocation *)0x15fc78);
        posix::Abort();
      }
      goto LAB_0015fcd2;
    }
    __gnu_cxx::
    __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

ParameterizedTestCaseInfo<TestCase>* GetTestCasePatternHolder(
      const char* test_case_name,
      CodeLocation code_location) {
    ParameterizedTestCaseInfo<TestCase>* typed_test_info = NULL;
    for (TestCaseInfoContainer::iterator it = test_case_infos_.begin();
         it != test_case_infos_.end(); ++it) {
      if ((*it)->GetTestCaseName() == test_case_name) {
        if ((*it)->GetTestCaseTypeId() != GetTypeId<TestCase>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test case setup and tear-down in this case.
          ReportInvalidTestCaseType(test_case_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestCaseInfo<TestCase> >(*it);
        }
        break;
      }
    }
    if (typed_test_info == NULL) {
      typed_test_info = new ParameterizedTestCaseInfo<TestCase>(
          test_case_name, code_location);
      test_case_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }